

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_buffer_reference_block
          (CompilerGLSL *this,uint32_t type_id,bool forward_declaration)

{
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variables_primary;
  size_t sVar1;
  CompilerGLSL *this_01;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  SPIRType *pSVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  iterator iVar8;
  long *plVar9;
  SPIRType *type;
  TypedID<(spirv_cross::Types)0> *ts_1;
  string *name;
  uint *ts_1_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type *psVar11;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  __hashtable *__h_1;
  ParsedIR *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  ID *__k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  long lVar14;
  ulong uVar15;
  uint32_t alignment;
  string buffer_name;
  string decorations;
  Bitset flags;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attributes;
  __node_gen_type __node_gen;
  uint local_12fc;
  CompilerGLSL *local_12f8;
  uint32_t local_12ec;
  key_type local_12e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12c8;
  TypedID<(spirv_cross::Types)1> *local_12a8;
  undefined1 local_12a0 [64];
  string local_1260;
  undefined1 local_1240 [16];
  undefined1 local_1230 [264];
  undefined1 local_1128 [8];
  size_type sStack_1120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1118;
  uint *local_1108;
  size_t local_1100;
  size_t local_10f8;
  uint local_10f0 [8];
  bool *local_10d0;
  size_t local_10c8;
  size_t local_10c0;
  bool local_10b8 [8];
  uint32_t local_10b0;
  bool local_10ac;
  bool local_10ab;
  StorageClass local_10a8;
  undefined1 local_10a0 [56];
  uint *local_1068;
  size_t local_1060;
  size_t local_1058;
  uint local_1050 [8];
  undefined1 local_1030 [28];
  TypeID local_1014;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1010 [68];
  Buffer *local_110;
  size_t local_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  local_12ec = type_id;
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      type_id);
  local_12e8._M_dataplus._M_p = (pointer)&local_12e8.field_2;
  local_12e8._M_string_length = 0;
  local_12e8.field_2._M_local_buf[0] = '\0';
  if (((int)CONCAT71(in_register_00000011,forward_declaration) == 0) ||
     (bVar2 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,pSVar5), !bVar2))
  {
    ts_1_00 = (uint *)0x0;
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1128,this,pSVar5);
    ::std::__cxx11::string::operator=((string *)&local_12e8,(string *)local_1128);
    if (local_1128 != (undefined1  [8])&local_1118) {
      operator_delete((void *)local_1128);
    }
    if (!forward_declaration) {
      iVar8 = ::std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->super_Compiler).physical_storage_type_to_alignment._M_h,&local_12ec);
      local_12fc = 0;
      if (iVar8.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_false>
          ._M_cur != (__node_type *)0x0) {
        local_12fc = *(uint *)((long)iVar8.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_false>
                                     ._M_cur + 0xc);
      }
      bVar2 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,pSVar5);
      local_12f8 = this;
      if (bVar2) {
        local_1240._0_8_ = local_1230 + 8;
        local_1240._8_8_ = 0;
        local_1230._0_8_ = (pointer)0x8;
        local_1128 = (undefined1  [8])&local_1118;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1128,"buffer_reference","");
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1240,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if (local_1128 != (undefined1  [8])&local_1118) {
          operator_delete((void *)local_1128);
        }
        if (local_12fc != 0) {
          join<char_const(&)[26],unsigned_int&>
                    ((string *)local_1128,(spirv_cross *)0x307f30,(char (*) [26])&local_12fc,ts_1_00
                    );
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_1240,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_1128);
          if (local_1128 != (undefined1  [8])&local_1118) {
            operator_delete((void *)local_1128);
          }
        }
        buffer_to_packing_standard_abi_cxx11_((string *)local_1128,this,pSVar5,true,true);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1240,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if (local_1128 != (undefined1  [8])&local_1118) {
          operator_delete((void *)local_1128);
        }
        ParsedIR::get_buffer_block_type_flags
                  ((Bitset *)local_12a0,&(this->super_Compiler).ir,pSVar5);
        paVar10 = &local_12c8.field_2;
        local_12c8._M_string_length = 0;
        local_12c8.field_2._M_local_buf[0] = '\0';
        uVar3 = (uint)local_12a0._0_8_;
        local_12c8._M_dataplus._M_p = (pointer)paVar10;
        if ((uVar3 >> 0x13 & 1) != 0) {
          ::std::__cxx11::string::append((char *)&local_12c8);
          uVar3 = (uint)local_12a0._0_8_;
        }
        if ((uVar3 >> 0x17 & 1) != 0) {
          ::std::__cxx11::string::append((char *)&local_12c8);
          uVar3 = (uint)local_12a0._0_8_;
        }
        if ((uVar3 >> 0x19 & 1) != 0) {
          ::std::__cxx11::string::append((char *)&local_12c8);
          uVar3 = (uint)local_12a0._0_8_;
        }
        if ((uVar3 >> 0x18 & 1) != 0) {
          ::std::__cxx11::string::append((char *)&local_12c8);
        }
        local_110 = local_f8;
        local_1118._M_allocated_capacity = 0;
        local_1128 = (undefined1  [8])0x0;
        sStack_1120 = 0;
        local_108 = 0;
        local_100 = 8;
        StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
        if (local_1240._8_8_ != 0) {
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_1240._0_8_ + local_1240._8_8_ * 0x20);
          pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_1240._0_8_;
          do {
            StringStream<4096UL,_4096UL>::append
                      ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar13->_M_dataplus)._M_p,
                       pbVar13->_M_string_length);
            if (pbVar13 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_1240._0_8_ + local_1240._8_8_ * 0x20 + -0x20)) {
              StringStream<4096UL,_4096UL>::append
                        ((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
            }
            pbVar13 = pbVar13 + 1;
          } while (pbVar13 != pbVar12);
        }
        StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_1260,local_1128);
        StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
        this = local_12f8;
        statement<char_const(&)[8],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&>
                  (local_12f8,(char (*) [8])"layout(",&local_1260,(char (*) [2])0x30f9b8,&local_12c8
                   ,(char (*) [9])0x307f69,&local_12e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1260._M_dataplus._M_p != &local_1260.field_2) {
          operator_delete(local_1260._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_12c8._M_dataplus._M_p != paVar10) {
          operator_delete(local_12c8._M_dataplus._M_p);
        }
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)(local_12a0 + 8));
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                        *)local_1240);
      }
      else {
        local_1240._0_8_ = local_1230;
        local_1240._8_8_ = 0;
        local_1230._0_8_ = local_1230._0_8_ & 0xffffffffffffff00;
        if (pSVar5->basetype == Struct) {
          buffer_to_packing_standard_abi_cxx11_((string *)local_12a0,this,pSVar5,true,false);
          plVar9 = (long *)::std::__cxx11::string::append(local_12a0);
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 == paVar10) {
            local_1118._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_1118._8_8_ = plVar9[3];
            local_1128 = (undefined1  [8])&local_1118;
          }
          else {
            local_1118._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_1128 = (undefined1  [8])*plVar9;
          }
          sStack_1120 = plVar9[1];
          *plVar9 = (long)paVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          ::std::__cxx11::string::operator=((string *)local_1240,(string *)local_1128);
          if (local_1128 != (undefined1  [8])&local_1118) {
            operator_delete((void *)local_1128);
          }
          if ((undefined1 *)local_12a0._0_8_ != local_12a0 + 0x10) {
            operator_delete((void *)local_12a0._0_8_);
          }
        }
        else {
          type = Compiler::get_pointee_type(&this->super_Compiler,pSVar5);
          bVar2 = Compiler::is_array(&this->super_Compiler,type);
          if (bVar2) {
            local_1108 = local_10f0;
            local_1128 = (undefined1  [8])&PTR__SPIRType_003a2fa8;
            sStack_1120 = 0x1e00000000;
            local_1118._M_allocated_capacity = 0;
            local_1118._8_8_ = 0x100000001;
            local_1100 = 0;
            local_10f8 = 8;
            local_10d0 = local_10b8;
            local_10c8 = 0;
            local_10c0 = 8;
            local_10b0 = 0;
            local_10ac = false;
            local_10ab = false;
            local_10a8 = StorageClassGeneric;
            local_10a0._0_8_ = local_10a0 + 0x18;
            local_10a0._8_8_ = 0;
            local_10a0._16_8_ = 8;
            local_1068 = local_1050;
            local_1060 = 0;
            local_1058 = 8;
            local_1010[0]._M_buckets = &local_1010[0]._M_single_bucket;
            local_1030._0_7_ = 0;
            local_1030._7_4_ = 0;
            local_1014.id = 0;
            local_1030._12_4_ = 0;
            local_1030._16_4_ = ImageFormatUnknown;
            local_1030[0x14] = '\0';
            local_1030[0x15] = '\0';
            local_1030[0x16] = '\0';
            local_1030[0x17] = '\0';
            local_1030[0x18] = '\0';
            local_1030[0x19] = '\0';
            local_1030[0x1a] = '\0';
            local_1030[0x1b] = '\0';
            local_1010[0]._M_bucket_count = 1;
            local_1010[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_1010[0]._M_element_count = 0;
            local_1010[0]._M_rehash_policy._M_max_load_factor = 1.0;
            local_1010[0]._M_rehash_policy._M_next_resize = 0;
            local_1010[0]._M_single_bucket = (__node_base_ptr)0x0;
            this_02 = &(this->super_Compiler).ir;
            uVar4 = ParsedIR::increase_bound_by(this_02,1);
            sStack_1120 = CONCAT44(sStack_1120._4_4_,uVar4);
            uVar4 = Compiler::get_pointee_type_id(&this->super_Compiler,local_12ec);
            SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                      ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)local_10a0,
                       local_10a0._8_8_ + 1);
            ((TypedID<(spirv_cross::Types)1> *)(local_10a0._0_8_ + local_10a0._8_8_ * 4))->id =
                 uVar4;
            local_10a0._8_8_ = local_10a0._8_8_ + 1;
            ParsedIR::set_member_decoration(this_02,sStack_1120._0_4_,0,DecorationOffset,0);
            buffer_to_packing_standard_abi_cxx11_
                      (&local_12c8,this,(SPIRType *)local_1128,true,false);
            plVar9 = (long *)::std::__cxx11::string::append((char *)&local_12c8);
            psVar11 = (size_type *)(plVar9 + 2);
            if ((size_type *)*plVar9 == psVar11) {
              local_12a0._16_8_ = *psVar11;
              local_12a0._24_8_ = plVar9[3];
              local_12a0._0_8_ = local_12a0 + 0x10;
            }
            else {
              local_12a0._16_8_ = *psVar11;
              local_12a0._0_8_ = (size_type *)*plVar9;
            }
            local_12a0._8_8_ = plVar9[1];
            *plVar9 = (long)psVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_1240,(string *)local_12a0);
            if ((undefined1 *)local_12a0._0_8_ != local_12a0 + 0x10) {
              operator_delete((void *)local_12a0._0_8_);
            }
            this = local_12f8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_12c8._M_dataplus._M_p != &local_12c8.field_2) {
              operator_delete(local_12c8._M_dataplus._M_p);
            }
            local_1128 = (undefined1  [8])&PTR__SPIRType_003a2fa8;
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable(local_1010);
            local_1060 = 0;
            if (local_1068 != local_1050) {
              free(local_1068);
            }
            local_10a0._8_8_ = 0;
            if ((TypedID<(spirv_cross::Types)1> *)local_10a0._0_8_ !=
                (TypedID<(spirv_cross::Types)1> *)(local_10a0 + 0x18)) {
              free((void *)local_10a0._0_8_);
            }
            local_10c8 = 0;
            if (local_10d0 != local_10b8) {
              free(local_10d0);
            }
            local_1100 = 0;
            if (local_1108 != local_10f0) {
              free(local_1108);
            }
          }
        }
        if (local_12fc == 0) {
          statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[26],std::__cxx11::string&>
                    (this,(char (*) [8])"layout(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1240
                     ,(char (*) [26])0x307f58,&local_12e8);
        }
        else {
          statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[44],unsigned_int&,char_const(&)[10],std::__cxx11::string&>
                    (this,(char (*) [8])"layout(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1240
                     ,(char (*) [44])"buffer_reference, buffer_reference_align = ",&local_12fc,
                     (char (*) [10])0x307f68,&local_12e8);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1240._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1230) {
          operator_delete((void *)local_1240._0_8_);
        }
      }
      statement<char_const(&)[2]>(this,(char (*) [2])0x2f0d5c);
      this->indent = this->indent + 1;
      bVar2 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,pSVar5);
      if (bVar2) {
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::clear(&(pSVar5->member_name_cache)._M_h);
        sVar1 = (pSVar5->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
        if (sVar1 != 0) {
          local_12a8 = (pSVar5->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
          lVar14 = sVar1 << 2;
          uVar15 = 0;
          do {
            add_member_name(local_12f8,pSVar5,(uint32_t)uVar15);
            uVar3 = local_12a8[uVar15].id;
            local_1128 = (undefined1  [8])&local_1118;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"","");
            (*(local_12f8->super_Compiler)._vptr_Compiler[0x15])
                      (local_12f8,pSVar5,(ulong)uVar3,uVar15 & 0xffffffff,(string *)local_1128,0);
            if (local_1128 != (undefined1  [8])&local_1118) {
              operator_delete((void *)local_1128);
            }
            uVar15 = uVar15 + 1;
            lVar14 = lVar14 + -4;
          } while (lVar14 != 0);
        }
      }
      else {
        pSVar5 = Compiler::get_pointee_type(&this->super_Compiler,pSVar5);
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1128,this,pSVar5,0);
        (*(this->super_Compiler)._vptr_Compiler[0x26])(local_1240,this,pSVar5,0);
        statement<std::__cxx11::string,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1128,(char (*) [7])" value",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1240,
                   (char (*) [2])0x30eb86);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1240._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1230) {
          operator_delete((void *)local_1240._0_8_);
        }
        if (local_1128 != (undefined1  [8])&local_1118) {
          operator_delete((void *)local_1128);
        }
      }
      this_01 = local_12f8;
      end_scope_decl(local_12f8);
      statement<char_const(&)[1]>(this_01,(char (*) [1])0x2eb969);
      goto LAB_0025434d;
    }
  }
  else {
    ts_1 = (TypedID<(spirv_cross::Types)0> *)0x0;
    (*(this->super_Compiler)._vptr_Compiler[6])
              (local_1128,this,(ulong)(pSVar5->super_IVariant).self.id);
    __k = &(pSVar5->super_IVariant).self;
    ::std::__cxx11::string::operator=((string *)&local_12e8,(string *)local_1128);
    if (local_1128 != (undefined1  [8])&local_1118) {
      operator_delete((void *)local_1128);
    }
    this_00 = &(this->super_Compiler).ir.meta;
    pmVar6 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,__k);
    if ((((pmVar6->decoration).alias._M_string_length == 0) ||
        (iVar7 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find(&(this->block_ssbo_names)._M_h,&local_12e8),
        iVar7.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur != (__node_type *)0x0)) ||
       (iVar7 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&(this->resource_names)._M_h,&local_12e8),
       iVar7.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur != (__node_type *)0x0)) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                ((string *)local_1128,(spirv_cross *)0x2efe70,(char (*) [2])__k,ts_1);
      ::std::__cxx11::string::operator=((string *)&local_12e8,(string *)local_1128);
      if (local_1128 != (undefined1  [8])&local_1118) {
        operator_delete((void *)local_1128);
      }
    }
    variables_primary = &this->block_ssbo_names;
    name = &local_12e8;
    add_variable(this,variables_primary,&this->resource_names,name);
    if (local_12e8._M_string_length == 0) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                ((string *)local_1128,(spirv_cross *)0x2efe70,(char (*) [2])__k,
                 (TypedID<(spirv_cross::Types)0> *)name);
      ::std::__cxx11::string::operator=((string *)&local_12e8,(string *)local_1128);
      if (local_1128 != (undefined1  [8])&local_1118) {
        operator_delete((void *)local_1128);
      }
    }
    local_1128 = (undefined1  [8])&this->block_names;
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_1128,&local_12e8);
    local_1128 = (undefined1  [8])variables_primary;
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)variables_primary,&local_12e8);
    pmVar6 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,__k);
    ::std::__cxx11::string::_M_assign((string *)pmVar6);
  }
  statement<char_const(&)[33],std::__cxx11::string&,char_const(&)[2]>
            (this,(char (*) [33])"layout(buffer_reference) buffer ",&local_12e8,
             (char (*) [2])0x30eb86);
LAB_0025434d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12e8._M_dataplus._M_p != &local_12e8.field_2) {
    operator_delete(local_12e8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_reference_block(uint32_t type_id, bool forward_declaration)
{
	auto &type = get<SPIRType>(type_id);
	string buffer_name;

	if (forward_declaration && is_physical_pointer_to_buffer_block(type))
	{
		// Block names should never alias, but from HLSL input they kind of can because block types are reused for UAVs ...
		// Allow aliased name since we might be declaring the block twice. Once with buffer reference (forward declared) and one proper declaration.
		// The names must match up.
		buffer_name = to_name(type.self, false);

		// Shaders never use the block by interface name, so we don't
		// have to track this other than updating name caches.
		// If we have a collision for any reason, just fallback immediately.
		if (ir.meta[type.self].decoration.alias.empty() ||
		    block_ssbo_names.find(buffer_name) != end(block_ssbo_names) ||
		    resource_names.find(buffer_name) != end(resource_names))
		{
			buffer_name = join("_", type.self);
		}

		// Make sure we get something unique for both global name scope and block name scope.
		// See GLSL 4.5 spec: section 4.3.9 for details.
		add_variable(block_ssbo_names, resource_names, buffer_name);

		// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
		// This cannot conflict with anything else, so we're safe now.
		// We cannot reuse this fallback name in neither global scope (blocked by block_names) nor block name scope.
		if (buffer_name.empty())
			buffer_name = join("_", type.self);

		block_names.insert(buffer_name);
		block_ssbo_names.insert(buffer_name);

		// Ensure we emit the correct name when emitting non-forward pointer type.
		ir.meta[type.self].decoration.alias = buffer_name;
	}
	else
	{
		buffer_name = type_to_glsl(type);
	}

	if (!forward_declaration)
	{
		auto itr = physical_storage_type_to_alignment.find(type_id);
		uint32_t alignment = 0;
		if (itr != physical_storage_type_to_alignment.end())
			alignment = itr->second.alignment;

		if (is_physical_pointer_to_buffer_block(type))
		{
			SmallVector<std::string> attributes;
			attributes.push_back("buffer_reference");
			if (alignment)
				attributes.push_back(join("buffer_reference_align = ", alignment));
			attributes.push_back(buffer_to_packing_standard(type, true, true));

			auto flags = ir.get_buffer_block_type_flags(type);
			string decorations;
			if (flags.get(DecorationRestrict))
				decorations += " restrict";
			if (flags.get(DecorationCoherent))
				decorations += " coherent";
			if (flags.get(DecorationNonReadable))
				decorations += " writeonly";
			if (flags.get(DecorationNonWritable))
				decorations += " readonly";

			statement("layout(", merge(attributes), ")", decorations, " buffer ", buffer_name);
		}
		else
		{
			string packing_standard;
			if (type.basetype == SPIRType::Struct)
			{
				// The non-block type is embedded in a block, so we cannot use enhanced layouts :(
				packing_standard = buffer_to_packing_standard(type, true, false) + ", ";
			}
			else if (is_array(get_pointee_type(type)))
			{
				SPIRType wrap_type{OpTypeStruct};
				wrap_type.self = ir.increase_bound_by(1);
				wrap_type.member_types.push_back(get_pointee_type_id(type_id));
				ir.set_member_decoration(wrap_type.self, 0, DecorationOffset, 0);
				packing_standard = buffer_to_packing_standard(wrap_type, true, false) + ", ";
			}

			if (alignment)
				statement("layout(", packing_standard, "buffer_reference, buffer_reference_align = ", alignment, ") buffer ", buffer_name);
			else
				statement("layout(", packing_standard, "buffer_reference) buffer ", buffer_name);
		}

		begin_scope();

		if (is_physical_pointer_to_buffer_block(type))
		{
			type.member_name_cache.clear();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				emit_struct_member(type, member, i);
				i++;
			}
		}
		else
		{
			auto &pointee_type = get_pointee_type(type);
			statement(type_to_glsl(pointee_type), " value", type_to_array_glsl(pointee_type, 0), ";");
		}

		end_scope_decl();
		statement("");
	}
	else
	{
		statement("layout(buffer_reference) buffer ", buffer_name, ";");
	}
}